

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

void crypto::sha1_transform::transform(hash_word *state,hash_word *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  uVar10 = (uVar1 << 5 | uVar1 >> 0x1b) + state[4] + *data + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
           0x5a827999;
  uVar9 = uVar2 << 0x1e | uVar2 >> 2;
  uVar6 = uVar1 << 0x1e | uVar1 >> 2;
  uVar17 = ((uVar9 ^ uVar3) & uVar1 ^ uVar3) + uVar4 + data[1] + 0x5a827999 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar15 = data[2];
  uVar25 = ((uVar9 ^ uVar6) & uVar10 ^ uVar9) + uVar15 + uVar3 + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar11 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar10 = data[3];
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar9 + uVar10 + ((uVar11 ^ uVar6) & uVar17 ^ uVar6) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar9 = data[4];
  uVar7 = uVar6 + uVar9 + ((uVar18 ^ uVar11) & uVar25 ^ uVar11) + 0x5a827999 +
          (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar6 = data[5];
  uVar25 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar11 = uVar11 + uVar6 + ((uVar26 ^ uVar18) & uVar17 ^ uVar18) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar17 = data[6];
  uVar19 = uVar18 + uVar17 + ((uVar25 ^ uVar26) & uVar7 ^ uVar26) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar18 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = data[7];
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar27 = uVar26 + uVar7 + ((uVar18 ^ uVar25) & uVar11 ^ uVar25) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar11 = data[8];
  uVar26 = uVar25 + uVar11 + ((uVar12 ^ uVar18) & uVar19 ^ uVar18) + 0x5a827999 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar25 = data[9];
  uVar28 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar19 = uVar18 + uVar25 + ((uVar20 ^ uVar12) & uVar27 ^ uVar12) + 0x5a827999 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar18 = data[10];
  uVar12 = uVar12 + uVar18 + ((uVar28 ^ uVar20) & uVar26 ^ uVar20) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar27 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar26 = data[0xb];
  uVar8 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = uVar20 + uVar26 + ((uVar27 ^ uVar28) & uVar19 ^ uVar28) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar19 = data[0xc];
  uVar29 = uVar28 + uVar19 + ((uVar8 ^ uVar27) & uVar12 ^ uVar27) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar13 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = data[0xd];
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar28 = uVar27 + uVar12 + ((uVar13 ^ uVar8) & uVar20 ^ uVar8) + 0x5a827999 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar27 = data[0xe];
  uVar20 = uVar8 + uVar27 + ((uVar21 ^ uVar13) & uVar29 ^ uVar13) + 0x5a827999 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar30 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar8 = data[0xf];
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar28 = uVar13 + uVar8 + ((uVar30 ^ uVar21) & uVar28 ^ uVar21) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar13 = uVar11 ^ uVar12 ^ *data ^ uVar15;
  uVar14 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar22 = uVar21 + uVar14 + ((uVar29 ^ uVar30) & uVar20 ^ uVar30) + 0x5a827999 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar13 = uVar25 ^ uVar27 ^ data[1] ^ uVar10;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar16 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar30 = uVar30 + uVar16 + ((uVar20 ^ uVar29) & uVar28 ^ uVar29) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar15 = uVar18 ^ uVar8 ^ uVar15 ^ uVar9;
  uVar13 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar21 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar28 = uVar29 + uVar21 + ((uVar13 ^ uVar20) & uVar22 ^ uVar20) + 0x5a827999 +
           (uVar30 * 0x20 | uVar30 >> 0x1b);
  uVar29 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar15 = uVar10 ^ uVar6 ^ uVar26 ^ uVar14;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar10 = uVar20 + uVar15 + ((uVar29 ^ uVar13) & uVar30 ^ uVar13) + 0x5a827999 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar22 = uVar30 * 0x40000000 | uVar30 >> 2;
  uVar9 = uVar9 ^ uVar17 ^ uVar19 ^ uVar16;
  uVar23 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar20 = uVar13 + uVar23 + (uVar22 ^ uVar29 ^ uVar28) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar9 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar6 = uVar6 ^ uVar7 ^ uVar12 ^ uVar21;
  uVar24 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar13 = uVar29 + uVar24 + (uVar9 ^ uVar22 ^ uVar10) + 0x6ed9eba1 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar6 = uVar17 ^ uVar11 ^ uVar27 ^ uVar15;
  uVar28 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar30 = uVar22 + uVar28 + (uVar10 ^ uVar9 ^ uVar20) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar17 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar6 = uVar7 ^ uVar25 ^ uVar8 ^ uVar23;
  uVar29 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar6 = uVar9 + uVar29 + (uVar17 ^ uVar10 ^ uVar13) + 0x6ed9eba1 +
          (uVar30 * 0x20 | uVar30 >> 0x1b);
  uVar9 = uVar11 ^ uVar18 ^ uVar14 ^ uVar24;
  uVar13 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar10 + uVar13 + (uVar22 ^ uVar17 ^ uVar30) + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b)
  ;
  uVar30 = uVar30 * 0x40000000 | uVar30 >> 2;
  uVar10 = uVar25 ^ uVar26 ^ uVar16 ^ uVar28;
  uVar20 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar7 = uVar17 + uVar20 + (uVar30 ^ uVar22 ^ uVar6) + 0x6ed9eba1 + (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar10 = uVar18 ^ uVar19 ^ uVar21 ^ uVar29;
  uVar17 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar25 = uVar22 + uVar17 + (uVar6 ^ uVar30 ^ uVar9) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar10 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar26 ^ uVar12 ^ uVar15 ^ uVar13;
  uVar22 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar11 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar30 + uVar22 + (uVar10 ^ uVar6 ^ uVar7) + 0x6ed9eba1 + (uVar25 * 0x20 | uVar25 >> 0x1b)
  ;
  uVar9 = uVar19 ^ uVar27 ^ uVar23 ^ uVar20;
  uVar19 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar6 + uVar19 + (uVar11 ^ uVar10 ^ uVar25) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar6 = uVar12 ^ uVar8 ^ uVar24 ^ uVar17;
  uVar31 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar10 = uVar10 + uVar31 + (uVar25 ^ uVar11 ^ uVar7) + 0x6ed9eba1 + (uVar9 * 0x20 | uVar9 >> 0x1b)
  ;
  uVar18 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = uVar27 ^ uVar14 ^ uVar28 ^ uVar22;
  uVar12 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar7 = uVar11 + uVar12 + (uVar18 ^ uVar25 ^ uVar9) + 0x6ed9eba1 +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar6 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar8 ^ uVar16 ^ uVar29 ^ uVar19;
  uVar27 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar11 = uVar25 + uVar27 + (uVar6 ^ uVar18 ^ uVar10) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar10 = uVar14 ^ uVar21 ^ uVar13 ^ uVar31;
  uVar30 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar25 = uVar18 + uVar30 + (uVar9 ^ uVar6 ^ uVar7) + 0x6ed9eba1 + (uVar11 * 0x20 | uVar11 >> 0x1b)
  ;
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar10 = uVar16 ^ uVar15 ^ uVar20 ^ uVar12;
  uVar16 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar6 = uVar6 + uVar16 + (uVar7 ^ uVar9 ^ uVar11) + 0x6ed9eba1 + (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar10 = uVar21 ^ uVar23 ^ uVar17 ^ uVar27;
  uVar21 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar10 = uVar9 + uVar21 + (uVar11 ^ uVar7 ^ uVar25) + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar15 = uVar15 ^ uVar24 ^ uVar22 ^ uVar30;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar9 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = uVar7 + uVar15 + (uVar25 ^ uVar11 ^ uVar6) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b)
  ;
  uVar6 = uVar23 ^ uVar28 ^ uVar19 ^ uVar16;
  uVar14 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar18 = uVar11 + uVar14 + (uVar9 ^ uVar25 ^ uVar10) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar6 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar10 = uVar24 ^ uVar29 ^ uVar31 ^ uVar21;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar8 = uVar25 + uVar10 + (uVar6 ^ uVar9 ^ uVar7) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar25 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar28 ^ uVar13 ^ uVar12 ^ uVar15;
  uVar23 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar11 = uVar9 + uVar23 + (uVar25 ^ uVar6 ^ uVar18) + 0x6ed9eba1 + (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar26 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar9 = uVar29 ^ uVar20 ^ uVar27 ^ uVar14;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar29 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar6 + uVar9 + (uVar26 ^ uVar25 ^ uVar8) + 0x6ed9eba1 + (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar6 = uVar13 ^ uVar17 ^ uVar30 ^ uVar10;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar25 = uVar25 + uVar6 + ((uVar11 | uVar29) & uVar26 | uVar11 & uVar29) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar18 = uVar20 ^ uVar22 ^ uVar16 ^ uVar23;
  uVar8 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar28 = uVar26 + uVar8 + ((uVar7 | uVar11) & uVar29 | uVar7 & uVar11) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar17 = uVar17 ^ uVar19 ^ uVar21 ^ uVar9;
  uVar18 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar29 = uVar29 + uVar18 + ((uVar25 | uVar7) & uVar11 | uVar25 & uVar7) + -0x70e44324 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar17 = uVar22 ^ uVar31 ^ uVar15 ^ uVar6;
  uVar20 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar25 = uVar11 + uVar20 + ((uVar28 | uVar26) & uVar7 | uVar28 & uVar26) + -0x70e44324 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar28 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar17 = uVar19 ^ uVar12 ^ uVar14 ^ uVar8;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar11 = uVar7 + uVar17 + ((uVar29 | uVar28) & uVar26 | uVar29 & uVar28) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar13 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar7 = uVar31 ^ uVar27 ^ uVar10 ^ uVar18;
  uVar24 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar19 = uVar26 + uVar24 + ((uVar25 | uVar13) & uVar28 | uVar25 & uVar13) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar7 = uVar12 ^ uVar30 ^ uVar23 ^ uVar20;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar29 = uVar28 + uVar7 + ((uVar11 | uVar26) & uVar13 | uVar11 & uVar26) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar25 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar11 = uVar27 ^ uVar16 ^ uVar9 ^ uVar17;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar22 = uVar13 + uVar11 + ((uVar19 | uVar25) & uVar26 | uVar19 & uVar25) + -0x70e44324 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar12 = uVar30 ^ uVar21 ^ uVar6 ^ uVar24;
  uVar28 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar26 = uVar26 + uVar28 + ((uVar29 | uVar19) & uVar25 | uVar29 & uVar19) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar27 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar12 = uVar16 ^ uVar15 ^ uVar8 ^ uVar7;
  uVar13 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar25 = uVar25 + uVar13 + ((uVar22 | uVar27) & uVar19 | uVar22 & uVar27) + -0x70e44324 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar12 = uVar21 ^ uVar14 ^ uVar18 ^ uVar11;
  uVar16 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar19 + uVar16 + ((uVar26 | uVar22) & uVar27 | uVar26 & uVar22) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar19 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar15 = uVar15 ^ uVar10 ^ uVar20 ^ uVar28;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar29 = uVar27 + uVar15 + ((uVar25 | uVar19) & uVar22 | uVar25 & uVar19) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar25 = uVar14 ^ uVar23 ^ uVar17 ^ uVar13;
  uVar14 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar21 = uVar22 + uVar14 + ((uVar12 | uVar26) & uVar19 | uVar12 & uVar26) + -0x70e44324 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar27 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar10 = uVar10 ^ uVar9 ^ uVar24 ^ uVar16;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar12 = uVar19 + uVar10 + ((uVar29 | uVar27) & uVar26 | uVar29 & uVar27) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar29 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar25 = uVar23 ^ uVar6 ^ uVar7 ^ uVar15;
  uVar25 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar19 = uVar26 + uVar25 + ((uVar21 | uVar29) & uVar27 | uVar21 & uVar29) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar22 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar9 = uVar9 ^ uVar8 ^ uVar11 ^ uVar14;
  uVar26 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar27 = uVar27 + uVar26 + ((uVar12 | uVar22) & uVar29 | uVar12 & uVar22) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar6 ^ uVar18 ^ uVar28 ^ uVar10;
  uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar29 = uVar29 + uVar21 + ((uVar19 | uVar9) & uVar22 | uVar19 & uVar9) + -0x70e44324 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar6 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar19 = uVar8 ^ uVar20 ^ uVar13 ^ uVar25;
  uVar12 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar30 = uVar22 + uVar12 + ((uVar27 | uVar6) & uVar9 | uVar27 & uVar6) + -0x70e44324 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar19 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar18 = uVar18 ^ uVar17 ^ uVar16 ^ uVar26;
  uVar22 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar9 + uVar22 + ((uVar29 | uVar19) & uVar6 | uVar29 & uVar19) + -0x70e44324 +
           (uVar30 * 0x20 | uVar30 >> 0x1b);
  uVar8 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar9 = uVar20 ^ uVar24 ^ uVar15 ^ uVar21;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar6 = uVar6 + uVar9 + ((uVar30 | uVar8) & uVar19 | uVar30 & uVar8) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar20 = uVar30 * 0x40000000 | uVar30 >> 2;
  uVar17 = uVar17 ^ uVar7 ^ uVar14 ^ uVar12;
  uVar27 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar19 = uVar19 + uVar27 + (uVar20 ^ uVar8 ^ uVar18) + -0x359d3e2a +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar17 = uVar24 ^ uVar11 ^ uVar10 ^ uVar22;
  uVar24 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar8 = uVar8 + uVar24 + (uVar18 ^ uVar20 ^ uVar6) + -0x359d3e2a +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar6 = uVar7 ^ uVar28 ^ uVar25 ^ uVar9;
  uVar30 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar20 = uVar20 + uVar30 + (uVar17 ^ uVar18 ^ uVar19) + -0x359d3e2a +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar6 = uVar11 ^ uVar13 ^ uVar26 ^ uVar27;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar7 = uVar18 + uVar6 + (uVar19 ^ uVar17 ^ uVar8) + -0x359d3e2a +
          (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar18 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar11 = uVar28 ^ uVar16 ^ uVar21 ^ uVar24;
  uVar29 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar17 = uVar17 + uVar29 + (uVar18 ^ uVar19 ^ uVar20) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar8 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar11 = uVar13 ^ uVar15 ^ uVar12 ^ uVar30;
  uVar13 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar19 + uVar13 + (uVar8 ^ uVar18 ^ uVar7) + -0x359d3e2a +
          (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar19 = uVar16 ^ uVar14 ^ uVar22 ^ uVar6;
  uVar16 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar20 = uVar18 + uVar16 + (uVar11 ^ uVar8 ^ uVar17) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar15 = uVar15 ^ uVar10 ^ uVar9 ^ uVar29;
  uVar19 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar28 = uVar8 + uVar19 + (uVar17 ^ uVar11 ^ uVar7) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar18 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar15 = uVar14 ^ uVar25 ^ uVar27 ^ uVar13;
  uVar8 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar7 = uVar11 + uVar8 + (uVar18 ^ uVar17 ^ uVar20) + -0x359d3e2a +
          (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar14 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar15 = uVar10 ^ uVar26 ^ uVar24 ^ uVar16;
  uVar20 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar23 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar15 = uVar17 + uVar20 + (uVar14 ^ uVar18 ^ uVar28) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar10 = uVar25 ^ uVar21 ^ uVar30 ^ uVar19;
  uVar28 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar11 = uVar18 + uVar28 + (uVar23 ^ uVar14 ^ uVar7) + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar17 = uVar26 ^ uVar12 ^ uVar6 ^ uVar8;
  uVar18 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar26 = uVar14 + uVar18 + (uVar10 ^ uVar23 ^ uVar15) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar17 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar21 ^ uVar22 ^ uVar29 ^ uVar20;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar14 = uVar23 + uVar15 + (uVar17 ^ uVar10 ^ uVar11) + -0x359d3e2a +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar12 ^ uVar9 ^ uVar13 ^ uVar28;
  uVar25 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar10 + uVar25 + (uVar11 ^ uVar17 ^ uVar26) + -0x359d3e2a +
          (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar10 = uVar22 ^ uVar27 ^ uVar16 ^ uVar18;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar17 = uVar17 + uVar10 + (uVar26 ^ uVar11 ^ uVar14) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar12 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar15 = uVar9 ^ uVar24 ^ uVar19 ^ uVar15;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar11 = uVar11 + uVar15 + (uVar12 ^ uVar26 ^ uVar7) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar25 = uVar27 ^ uVar30 ^ uVar8 ^ uVar25;
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar25 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar26 = uVar26 + uVar25 + (uVar7 ^ uVar12 ^ uVar17) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar10 = uVar24 ^ uVar6 ^ uVar20 ^ uVar10;
  uVar9 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = (uVar10 << 1 | (uint)((int)uVar10 < 0)) + uVar12 + (uVar9 ^ uVar7 ^ uVar11) + -0x359d3e2a
           + (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar15 = uVar29 ^ uVar30 ^ uVar28 ^ uVar15;
  uVar10 = uVar11 * 0x40000000 | uVar11 >> 2;
  iVar5 = (uVar15 << 1 | (uint)((int)uVar15 < 0)) + uVar7 + (uVar10 ^ uVar9 ^ uVar26) +
          (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar25 = uVar13 ^ uVar6 ^ uVar18 ^ uVar25;
  uVar6 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar15 = iVar5 + 0xca62c1d6;
  *state = (uVar25 << 1 | (uint)((int)uVar25 < 0)) + uVar1 + uVar9 + (uVar6 ^ uVar10 ^ uVar17) +
           -0x359d3e2a + (uVar15 * 0x20 | uVar15 >> 0x1b);
  state[1] = uVar2 + iVar5 + 0xca62c1d6;
  state[2] = (uVar17 * 0x40000000 | uVar17 >> 2) + uVar3;
  state[3] = uVar6 + uVar4;
  state[4] = uVar10 + state[4];
  return;
}

Assistant:

void sha1_transform::transform(hash_word * state, const hash_word * data) {
	
	#define blk0(i) (W[i] = data[i])
	#define blk1(i) (W[i & 15] = util::rotl_fixed(W[(i + 13) & 15] ^ W[(i + 8) & 15] \
	                                              ^ W[(i + 2) & 15] ^ W[i & 15], 1))
	
	#define f1(x, y, z) (z ^ (x & (y ^ z)))
	#define f2(x, y, z) (x ^ y ^ z)
	#define f3(x, y, z) ((x & y) | (z & (x | y)))
	#define f4(x, y, z) (x ^ y ^ z)
	
	/* (R0+R1), R2, R3, R4 are the different operations used in SHA1 */
	#define R0(v, w, x, y, z, i) \
		z += f1(w, x, y) + blk0(i) + 0x5A827999 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R1(v, w, x, y, z, i) \
		z += f1(w, x, y) + blk1(i) + 0x5A827999 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R2(v, w, x, y, z, i) \
		z += f2(w, x, y) + blk1(i) + 0x6ED9EBA1 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R3(v, w, x, y, z, i) \
		z += f3(w, x, y) + blk1(i) + 0x8F1BBCDC + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R4(v, w, x, y, z, i) \
		z += f4(w, x, y) + blk1(i) + 0xCA62C1D6 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	
	hash_word W[16];
	
	/* Copy context->state[] to working vars */
	hash_word a = state[0];
	hash_word b = state[1];
	hash_word c = state[2];
	hash_word d = state[3];
	hash_word e = state[4];
	
	/* 4 rounds of 20 operations each. Loop unrolled. */
	
	R0(a, b, c, d, e,  0);
	R0(e, a, b, c, d,  1);
	R0(d, e, a, b, c,  2);
	R0(c, d, e, a, b,  3);
	
	R0(b, c, d, e, a,  4);
	R0(a, b, c, d, e,  5);
	R0(e, a, b, c, d,  6);
	R0(d, e, a, b, c,  7);
	
	R0(c, d, e, a, b,  8);
	R0(b, c, d, e, a,  9);
	R0(a, b, c, d, e, 10);
	R0(e, a, b, c, d, 11);
	
	R0(d, e, a, b, c, 12);
	R0(c, d, e, a, b, 13);
	R0(b, c, d, e, a, 14);
	R0(a, b, c, d, e, 15);
	
	R1(e, a, b, c, d, 16);
	R1(d, e, a, b, c, 17);
	R1(c, d, e, a, b, 18);
	R1(b, c, d, e, a, 19);
	
	R2(a, b, c, d, e, 20);
	R2(e, a, b, c, d, 21);
	R2(d, e, a, b, c, 22);
	R2(c, d, e, a, b, 23);
	
	R2(b, c, d, e, a, 24);
	R2(a, b, c, d, e, 25);
	R2(e, a, b, c, d, 26);
	R2(d, e, a, b, c, 27);
	
	R2(c, d, e, a, b, 28);
	R2(b, c, d, e, a, 29);
	R2(a, b, c, d, e, 30);
	R2(e, a, b, c, d, 31);
	
	R2(d, e, a, b, c, 32);
	R2(c, d, e, a, b, 33);
	R2(b, c, d, e, a, 34);
	R2(a, b, c, d, e, 35);
	
	R2(e, a, b, c, d, 36);
	R2(d, e, a, b, c, 37);
	R2(c, d, e, a, b, 38);
	R2(b, c, d, e, a, 39);
	
	R3(a, b, c, d, e, 40);
	R3(e, a, b, c, d, 41);
	R3(d, e, a, b, c, 42);
	R3(c, d, e, a, b, 43);
	
	R3(b, c, d, e, a, 44);
	R3(a, b, c, d, e, 45);
	R3(e, a, b, c, d, 46);
	R3(d, e, a, b, c, 47);
	
	R3(c, d, e, a, b, 48);
	R3(b, c, d, e, a, 49);
	R3(a, b, c, d, e, 50);
	R3(e, a, b, c, d, 51);
	
	R3(d, e, a, b, c, 52);
	R3(c, d, e, a, b, 53);
	R3(b, c, d, e, a, 54);
	R3(a, b, c, d, e, 55);
	
	R3(e, a, b, c, d, 56);
	R3(d, e, a, b, c, 57);
	R3(c, d, e, a, b, 58);
	R3(b, c, d, e, a, 59);
	
	R4(a, b, c, d, e, 60);
	R4(e, a, b, c, d, 61);
	R4(d, e, a, b, c, 62);
	R4(c, d, e, a, b, 63);
	
	R4(b, c, d, e, a, 64);
	R4(a, b, c, d, e, 65);
	R4(e, a, b, c, d, 66);
	R4(d, e, a, b, c, 67);
	
	R4(c, d, e, a, b, 68);
	R4(b, c, d, e, a, 69);
	R4(a, b, c, d, e, 70);
	R4(e, a, b, c, d, 71);
	
	R4(d, e, a, b, c, 72);
	R4(c, d, e, a, b, 73);
	R4(b, c, d, e, a, 74);
	R4(a, b, c, d, e, 75);
	
	R4(e, a, b, c, d, 76);
	R4(d, e, a, b, c, 77);
	R4(c, d, e, a, b, 78);
	R4(b, c, d, e, a, 79);
	
	/* Add the working vars back into context.state[] */
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
	
	#undef R4
	#undef R3
	#undef R2
	#undef R1
	#undef R0
	
	#undef f4
	#undef f3
	#undef f2
	#undef f1
	
	#undef blk1
	#undef blk0
	
}